

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.h
# Opt level: O3

uint64_t avx2_harley_seal_popcount256(__m256i *data,uint64_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  uVar3 = 0xfffffffffffffff0;
  auVar4[8] = 0xf;
  auVar4._0_8_ = 0xf0f0f0f0f0f0f0f;
  auVar4[9] = 0xf;
  auVar4[10] = 0xf;
  auVar4[0xb] = 0xf;
  auVar4[0xc] = 0xf;
  auVar4[0xd] = 0xf;
  auVar4[0xe] = 0xf;
  auVar4[0xf] = 0xf;
  auVar4[0x10] = 0xf;
  auVar4[0x11] = 0xf;
  auVar4[0x12] = 0xf;
  auVar4[0x13] = 0xf;
  auVar4[0x14] = 0xf;
  auVar4[0x15] = 0xf;
  auVar4[0x16] = 0xf;
  auVar4[0x17] = 0xf;
  auVar4[0x18] = 0xf;
  auVar4[0x19] = 0xf;
  auVar4[0x1a] = 0xf;
  auVar4[0x1b] = 0xf;
  auVar4[0x1c] = 0xf;
  auVar4[0x1d] = 0xf;
  auVar4[0x1e] = 0xf;
  auVar4[0x1f] = 0xf;
  auVar6._16_16_ = _DAT_001242f0;
  auVar6._0_16_ = _DAT_001242f0;
  auVar5._16_16_ = _DAT_00124300;
  auVar5._0_16_ = _DAT_00124300;
  auVar16 = ZEXT864(0) << 0x40;
  auVar21 = ZEXT864(0) << 0x40;
  auVar13 = ZEXT864(0) << 0x40;
  auVar9 = ZEXT864(0) << 0x40;
  do {
    auVar12 = vlddqu_avx((undefined1  [32])*data);
    auVar8 = vlddqu_avx((undefined1  [32])data[1]);
    auVar27._0_8_ = auVar12._0_8_ ^ auVar16._0_8_;
    auVar27._8_8_ = auVar12._8_8_ ^ auVar16._8_8_;
    auVar27._16_8_ = auVar12._16_8_ ^ auVar16._16_8_;
    auVar27._24_8_ = auVar12._24_8_ ^ auVar16._24_8_;
    auVar12 = vandpd_avx(auVar12,auVar16._0_32_);
    auVar14 = vandpd_avx(auVar27,auVar8);
    auVar26 = vorpd_avx(auVar14,auVar12);
    auVar22._0_8_ = auVar27._0_8_ ^ auVar8._0_8_;
    auVar22._8_8_ = auVar27._8_8_ ^ auVar8._8_8_;
    auVar22._16_8_ = auVar27._16_8_ ^ auVar8._16_8_;
    auVar22._24_8_ = auVar27._24_8_ ^ auVar8._24_8_;
    auVar12 = vlddqu_avx((undefined1  [32])data[2]);
    auVar8 = vlddqu_avx((undefined1  [32])data[3]);
    auVar32._0_8_ = auVar22._0_8_ ^ auVar12._0_8_;
    auVar32._8_8_ = auVar22._8_8_ ^ auVar12._8_8_;
    auVar32._16_8_ = auVar22._16_8_ ^ auVar12._16_8_;
    auVar32._24_8_ = auVar22._24_8_ ^ auVar12._24_8_;
    auVar12 = vandpd_avx(auVar22,auVar12);
    auVar14 = vandpd_avx(auVar32,auVar8);
    auVar22 = vorpd_avx(auVar14,auVar12);
    auVar23._0_8_ = auVar32._0_8_ ^ auVar8._0_8_;
    auVar23._8_8_ = auVar32._8_8_ ^ auVar8._8_8_;
    auVar23._16_8_ = auVar32._16_8_ ^ auVar8._16_8_;
    auVar23._24_8_ = auVar32._24_8_ ^ auVar8._24_8_;
    auVar28._0_8_ = auVar26._0_8_ ^ auVar21._0_8_;
    auVar28._8_8_ = auVar26._8_8_ ^ auVar21._8_8_;
    auVar28._16_8_ = auVar26._16_8_ ^ auVar21._16_8_;
    auVar28._24_8_ = auVar26._24_8_ ^ auVar21._24_8_;
    auVar12 = vandpd_avx(auVar26,auVar21._0_32_);
    auVar14 = vandpd_avx(auVar22,auVar28);
    auVar26 = vorpd_avx(auVar14,auVar12);
    auVar17._0_8_ = auVar22._0_8_ ^ auVar28._0_8_;
    auVar17._8_8_ = auVar22._8_8_ ^ auVar28._8_8_;
    auVar17._16_8_ = auVar22._16_8_ ^ auVar28._16_8_;
    auVar17._24_8_ = auVar22._24_8_ ^ auVar28._24_8_;
    auVar12 = vlddqu_avx((undefined1  [32])data[4]);
    auVar8 = vlddqu_avx((undefined1  [32])data[5]);
    auVar33._0_8_ = auVar23._0_8_ ^ auVar12._0_8_;
    auVar33._8_8_ = auVar23._8_8_ ^ auVar12._8_8_;
    auVar33._16_8_ = auVar23._16_8_ ^ auVar12._16_8_;
    auVar33._24_8_ = auVar23._24_8_ ^ auVar12._24_8_;
    auVar12 = vandpd_avx(auVar23,auVar12);
    auVar14 = vandpd_avx(auVar33,auVar8);
    auVar22 = vorpd_avx(auVar14,auVar12);
    auVar24._0_8_ = auVar33._0_8_ ^ auVar8._0_8_;
    auVar24._8_8_ = auVar33._8_8_ ^ auVar8._8_8_;
    auVar24._16_8_ = auVar33._16_8_ ^ auVar8._16_8_;
    auVar24._24_8_ = auVar33._24_8_ ^ auVar8._24_8_;
    auVar12 = vlddqu_avx((undefined1  [32])data[6]);
    auVar8 = vlddqu_avx((undefined1  [32])data[7]);
    auVar39._0_8_ = auVar24._0_8_ ^ auVar12._0_8_;
    auVar39._8_8_ = auVar24._8_8_ ^ auVar12._8_8_;
    auVar39._16_8_ = auVar24._16_8_ ^ auVar12._16_8_;
    auVar39._24_8_ = auVar24._24_8_ ^ auVar12._24_8_;
    auVar12 = vandpd_avx(auVar24,auVar12);
    auVar14 = vandpd_avx(auVar39,auVar8);
    auVar11 = vorpd_avx(auVar14,auVar12);
    auVar29._0_8_ = auVar39._0_8_ ^ auVar8._0_8_;
    auVar29._8_8_ = auVar39._8_8_ ^ auVar8._8_8_;
    auVar29._16_8_ = auVar39._16_8_ ^ auVar8._16_8_;
    auVar29._24_8_ = auVar39._24_8_ ^ auVar8._24_8_;
    auVar34._0_8_ = auVar22._0_8_ ^ auVar17._0_8_;
    auVar34._8_8_ = auVar22._8_8_ ^ auVar17._8_8_;
    auVar34._16_8_ = auVar22._16_8_ ^ auVar17._16_8_;
    auVar34._24_8_ = auVar22._24_8_ ^ auVar17._24_8_;
    auVar12 = vandpd_avx(auVar22,auVar17);
    auVar14 = vandpd_avx(auVar11,auVar34);
    auVar8 = vorpd_avx(auVar14,auVar12);
    auVar25._0_8_ = auVar11._0_8_ ^ auVar34._0_8_;
    auVar25._8_8_ = auVar11._8_8_ ^ auVar34._8_8_;
    auVar25._16_8_ = auVar11._16_8_ ^ auVar34._16_8_;
    auVar25._24_8_ = auVar11._24_8_ ^ auVar34._24_8_;
    auVar35._0_8_ = auVar26._0_8_ ^ auVar13._0_8_;
    auVar35._8_8_ = auVar26._8_8_ ^ auVar13._8_8_;
    auVar35._16_8_ = auVar26._16_8_ ^ auVar13._16_8_;
    auVar35._24_8_ = auVar26._24_8_ ^ auVar13._24_8_;
    auVar12 = vandpd_avx(auVar26,auVar13._0_32_);
    auVar14 = vandpd_avx(auVar35,auVar8);
    auVar26 = vorpd_avx(auVar14,auVar12);
    auVar10._0_8_ = auVar35._0_8_ ^ auVar8._0_8_;
    auVar10._8_8_ = auVar35._8_8_ ^ auVar8._8_8_;
    auVar10._16_8_ = auVar35._16_8_ ^ auVar8._16_8_;
    auVar10._24_8_ = auVar35._24_8_ ^ auVar8._24_8_;
    auVar12 = vlddqu_avx((undefined1  [32])data[8]);
    auVar8 = vlddqu_avx((undefined1  [32])data[9]);
    auVar36._0_8_ = auVar29._0_8_ ^ auVar12._0_8_;
    auVar36._8_8_ = auVar29._8_8_ ^ auVar12._8_8_;
    auVar36._16_8_ = auVar29._16_8_ ^ auVar12._16_8_;
    auVar36._24_8_ = auVar29._24_8_ ^ auVar12._24_8_;
    auVar12 = vandpd_avx(auVar29,auVar12);
    auVar14 = vandpd_avx(auVar36,auVar8);
    auVar22 = vorpd_avx(auVar14,auVar12);
    auVar18._0_8_ = auVar36._0_8_ ^ auVar8._0_8_;
    auVar18._8_8_ = auVar36._8_8_ ^ auVar8._8_8_;
    auVar18._16_8_ = auVar36._16_8_ ^ auVar8._16_8_;
    auVar18._24_8_ = auVar36._24_8_ ^ auVar8._24_8_;
    auVar12 = vlddqu_avx((undefined1  [32])data[10]);
    auVar8 = vlddqu_avx((undefined1  [32])data[0xb]);
    auVar40._0_8_ = auVar12._0_8_ ^ auVar18._0_8_;
    auVar40._8_8_ = auVar12._8_8_ ^ auVar18._8_8_;
    auVar40._16_8_ = auVar12._16_8_ ^ auVar18._16_8_;
    auVar40._24_8_ = auVar12._24_8_ ^ auVar18._24_8_;
    auVar12 = vandpd_avx(auVar12,auVar18);
    auVar14 = vandpd_avx(auVar40,auVar8);
    auVar11 = vorpd_avx(auVar14,auVar12);
    auVar30._0_8_ = auVar40._0_8_ ^ auVar8._0_8_;
    auVar30._8_8_ = auVar40._8_8_ ^ auVar8._8_8_;
    auVar30._16_8_ = auVar40._16_8_ ^ auVar8._16_8_;
    auVar30._24_8_ = auVar40._24_8_ ^ auVar8._24_8_;
    auVar37._0_8_ = auVar25._0_8_ ^ auVar22._0_8_;
    auVar37._8_8_ = auVar25._8_8_ ^ auVar22._8_8_;
    auVar37._16_8_ = auVar25._16_8_ ^ auVar22._16_8_;
    auVar37._24_8_ = auVar25._24_8_ ^ auVar22._24_8_;
    auVar12 = vandpd_avx(auVar25,auVar22);
    auVar14 = vandpd_avx(auVar37,auVar11);
    auVar22 = vorpd_avx(auVar14,auVar12);
    auVar19._0_8_ = auVar37._0_8_ ^ auVar11._0_8_;
    auVar19._8_8_ = auVar37._8_8_ ^ auVar11._8_8_;
    auVar19._16_8_ = auVar37._16_8_ ^ auVar11._16_8_;
    auVar19._24_8_ = auVar37._24_8_ ^ auVar11._24_8_;
    auVar12 = vlddqu_avx((undefined1  [32])data[0xc]);
    auVar8 = vlddqu_avx((undefined1  [32])data[0xd]);
    auVar41._0_8_ = auVar30._0_8_ ^ auVar12._0_8_;
    auVar41._8_8_ = auVar30._8_8_ ^ auVar12._8_8_;
    auVar41._16_8_ = auVar30._16_8_ ^ auVar12._16_8_;
    auVar41._24_8_ = auVar30._24_8_ ^ auVar12._24_8_;
    auVar12 = vandpd_avx(auVar30,auVar12);
    auVar14 = vandpd_avx(auVar41,auVar8);
    auVar11 = vorpd_avx(auVar14,auVar12);
    auVar14._0_8_ = auVar41._0_8_ ^ auVar8._0_8_;
    auVar14._8_8_ = auVar41._8_8_ ^ auVar8._8_8_;
    auVar14._16_8_ = auVar41._16_8_ ^ auVar8._16_8_;
    auVar14._24_8_ = auVar41._24_8_ ^ auVar8._24_8_;
    auVar12 = vlddqu_avx((undefined1  [32])data[0xe]);
    auVar8 = vlddqu_avx((undefined1  [32])data[0xf]);
    auVar43._0_8_ = auVar12._0_8_ ^ auVar14._0_8_;
    auVar43._8_8_ = auVar12._8_8_ ^ auVar14._8_8_;
    auVar43._16_8_ = auVar12._16_8_ ^ auVar14._16_8_;
    auVar43._24_8_ = auVar12._24_8_ ^ auVar14._24_8_;
    auVar12 = vandpd_avx(auVar12,auVar14);
    auVar14 = vandpd_avx(auVar43,auVar8);
    auVar17 = vorpd_avx(auVar14,auVar12);
    auVar15._0_8_ = auVar43._0_8_ ^ auVar8._0_8_;
    auVar15._8_8_ = auVar43._8_8_ ^ auVar8._8_8_;
    auVar15._16_8_ = auVar43._16_8_ ^ auVar8._16_8_;
    auVar15._24_8_ = auVar43._24_8_ ^ auVar8._24_8_;
    auVar16 = ZEXT3264(auVar15);
    auVar42._0_8_ = auVar11._0_8_ ^ auVar19._0_8_;
    auVar42._8_8_ = auVar11._8_8_ ^ auVar19._8_8_;
    auVar42._16_8_ = auVar11._16_8_ ^ auVar19._16_8_;
    auVar42._24_8_ = auVar11._24_8_ ^ auVar19._24_8_;
    auVar12 = vandpd_avx(auVar11,auVar19);
    auVar14 = vandpd_avx(auVar17,auVar42);
    auVar8 = vorpd_avx(auVar14,auVar12);
    auVar20._0_8_ = auVar17._0_8_ ^ auVar42._0_8_;
    auVar20._8_8_ = auVar17._8_8_ ^ auVar42._8_8_;
    auVar20._16_8_ = auVar17._16_8_ ^ auVar42._16_8_;
    auVar20._24_8_ = auVar17._24_8_ ^ auVar42._24_8_;
    auVar21 = ZEXT3264(auVar20);
    auVar38._0_8_ = auVar22._0_8_ ^ auVar10._0_8_;
    auVar38._8_8_ = auVar22._8_8_ ^ auVar10._8_8_;
    auVar38._16_8_ = auVar22._16_8_ ^ auVar10._16_8_;
    auVar38._24_8_ = auVar22._24_8_ ^ auVar10._24_8_;
    auVar12 = vandpd_avx(auVar22,auVar10);
    auVar14 = vandpd_avx(auVar8,auVar38);
    auVar22 = vorpd_avx(auVar14,auVar12);
    auVar11._0_8_ = auVar8._0_8_ ^ auVar38._0_8_;
    auVar11._8_8_ = auVar8._8_8_ ^ auVar38._8_8_;
    auVar11._16_8_ = auVar8._16_8_ ^ auVar38._16_8_;
    auVar11._24_8_ = auVar8._24_8_ ^ auVar38._24_8_;
    auVar13 = ZEXT3264(auVar11);
    auVar31._0_8_ = auVar26._0_8_ ^ auVar9._0_8_;
    auVar31._8_8_ = auVar26._8_8_ ^ auVar9._8_8_;
    auVar31._16_8_ = auVar26._16_8_ ^ auVar9._16_8_;
    auVar31._24_8_ = auVar26._24_8_ ^ auVar9._24_8_;
    auVar12 = vandpd_avx(auVar26,auVar9._0_32_);
    auVar14 = vandpd_avx(auVar22,auVar31);
    auVar12 = vorpd_avx(auVar14,auVar12);
    auVar8._0_8_ = auVar22._0_8_ ^ auVar31._0_8_;
    auVar8._8_8_ = auVar22._8_8_ ^ auVar31._8_8_;
    auVar8._16_8_ = auVar22._16_8_ ^ auVar31._16_8_;
    auVar8._24_8_ = auVar22._24_8_ ^ auVar31._24_8_;
    auVar9 = ZEXT3264(auVar8);
    auVar26 = vpsrlw_avx2(auVar12,4);
    auVar12 = vpand_avx2(auVar12,auVar4);
    auVar14 = vpshufb_avx2(auVar6,auVar12);
    auVar12 = vpand_avx2(auVar26,auVar4);
    auVar12 = vpshufb_avx2(auVar5,auVar12);
    auVar12 = vpsadbw_avx2(auVar14,auVar12);
    auVar12 = vpaddq_avx2(auVar12,auVar7._0_32_);
    auVar7 = ZEXT3264(auVar12);
    uVar3 = uVar3 + 0x10;
    data = data + 0x10;
  } while (uVar3 < 0xf0);
  auVar26 = vpsllq_avx2(auVar12,4);
  auVar22 = vpsrlw_avx2(auVar8,4);
  auVar12 = vpand_avx2(auVar8,auVar4);
  auVar14 = vpshufb_avx2(auVar6,auVar12);
  auVar12 = vpand_avx2(auVar22,auVar4);
  auVar12 = vpshufb_avx2(auVar5,auVar12);
  auVar12 = vpsadbw_avx2(auVar12,auVar14);
  auVar8 = vpsllq_avx2(auVar12,3);
  auVar22 = vpsrlw_avx2(auVar11,4);
  auVar12 = vpand_avx2(auVar11,auVar4);
  auVar14 = vpshufb_avx2(auVar6,auVar12);
  auVar12 = vpand_avx2(auVar22,auVar4);
  auVar12 = vpshufb_avx2(auVar5,auVar12);
  auVar12 = vpsadbw_avx2(auVar12,auVar14);
  auVar12 = vpsllq_avx2(auVar12,2);
  auVar12 = vpaddq_avx2(auVar8,auVar12);
  auVar22 = vpsrlw_avx2(auVar20,4);
  auVar14 = vpand_avx2(auVar20,auVar4);
  auVar8 = vpshufb_avx2(auVar6,auVar14);
  auVar14 = vpand_avx2(auVar22,auVar4);
  auVar14 = vpshufb_avx2(auVar5,auVar14);
  auVar14 = vpsadbw_avx2(auVar8,auVar14);
  auVar14 = vpaddq_avx2(auVar14,auVar14);
  auVar12 = vpaddq_avx2(auVar12,auVar14);
  auVar12 = vpaddq_avx2(auVar12,auVar26);
  auVar8 = vpsrlw_avx2(auVar15,4);
  auVar14 = vpand_avx2(auVar15,auVar4);
  auVar6 = vpshufb_avx2(auVar6,auVar14);
  auVar4 = vpand_avx2(auVar8,auVar4);
  auVar4 = vpshufb_avx2(auVar5,auVar4);
  auVar4 = vpsadbw_avx2(auVar6,auVar4);
  auVar4 = vpaddq_avx2(auVar12,auVar4);
  auVar1 = vpaddq_avx(auVar4._0_16_,auVar4._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddq_avx(auVar1,auVar2);
  return auVar1._0_8_;
}

Assistant:

static uint64_t avx2_harley_seal_popcount256(const __m256i *data,
                                                    const uint64_t size) {
    __m256i total = _mm256_setzero_si256();
    __m256i ones = _mm256_setzero_si256();
    __m256i twos = _mm256_setzero_si256();
    __m256i fours = _mm256_setzero_si256();
    __m256i eights = _mm256_setzero_si256();
    __m256i sixteens = _mm256_setzero_si256();
    __m256i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;

    for (; i < limit; i += 16) {
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i),
            _mm256_lddqu_si256(data + i + 1));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 2),
            _mm256_lddqu_si256(data + i + 3));
        CSA(&foursA, &twos, twos, twosA, twosB);
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i + 4),
            _mm256_lddqu_si256(data + i + 5));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 6),
            _mm256_lddqu_si256(data + i + 7));
        CSA(&foursB, &twos, twos, twosA, twosB);
        CSA(&eightsA, &fours, fours, foursA, foursB);
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i + 8),
            _mm256_lddqu_si256(data + i + 9));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 10),
            _mm256_lddqu_si256(data + i + 11));
        CSA(&foursA, &twos, twos, twosA, twosB);
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i + 12),
            _mm256_lddqu_si256(data + i + 13));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 14),
            _mm256_lddqu_si256(data + i + 15));
        CSA(&foursB, &twos, twos, twosA, twosB);
        CSA(&eightsB, &fours, fours, foursA, foursB);
        CSA(&sixteens, &eights, eights, eightsA, eightsB);

        total = _mm256_add_epi64(total, popcount256(sixteens));
    }

    total = _mm256_slli_epi64(total, 4);  // * 16
    total = _mm256_add_epi64(
        total, _mm256_slli_epi64(popcount256(eights), 3));  // += 8 * ...
    total = _mm256_add_epi64(
        total, _mm256_slli_epi64(popcount256(fours), 2));  // += 4 * ...
    total = _mm256_add_epi64(
        total, _mm256_slli_epi64(popcount256(twos), 1));  // += 2 * ...
    total = _mm256_add_epi64(total, popcount256(ones));
    for (; i < size; i++)
        total =
            _mm256_add_epi64(total, popcount256(_mm256_lddqu_si256(data + i)));

    return (uint64_t)(_mm256_extract_epi64(total, 0)) +
           (uint64_t)(_mm256_extract_epi64(total, 1)) +
           (uint64_t)(_mm256_extract_epi64(total, 2)) +
           (uint64_t)(_mm256_extract_epi64(total, 3));
}